

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::parser::set_option(parser *this,string *name,string *value)

{
  uint uVar1;
  size_type sVar2;
  mapped_type *ppoVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 in_RDX;
  long in_RDI;
  value_type *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  key_type *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  *in_stack_ffffffffffffff40;
  string local_a8 [16];
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string local_68 [48];
  string local_38 [32];
  undefined8 local_18;
  
  local_18 = in_RDX;
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (sVar2 == 0) {
    std::operator+(in_stack_ffffffffffffff78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(local_38);
  }
  else {
    ppoVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                            *)in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
    uVar1 = (*(*ppoVar3)->_vptr_option_base[4])(*ppoVar3,local_18);
    if ((uVar1 & 1) == 0) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xa0);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
      std::operator+(in_stack_ffffffffffffff78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff70);
      std::operator+(__lhs,(char *)__rhs);
      std::operator+(__lhs,__rhs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__rhs,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      std::__cxx11::string::~string(local_a8);
    }
  }
  return;
}

Assistant:

void set_option(const std::string &name, const std::string &value){
    if (options.count(name)==0){
      errors.push_back("undefined option: --"+name);
      return;
    }
    if (!options[name]->set(value)){
      errors.push_back("option value is invalid: --"+name+"="+value);
      return;
    }
  }